

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# survey.c
# Opt level: O0

int surv0_ctx_set_survey_time(void *arg,void *buf,size_t sz,nni_opt_type t)

{
  int iVar1;
  int local_34;
  int rv;
  nng_duration expire;
  surv0_ctx *ctx;
  size_t sStack_20;
  nni_opt_type t_local;
  size_t sz_local;
  void *buf_local;
  void *arg_local;
  
  _rv = arg;
  ctx._4_4_ = t;
  sStack_20 = sz;
  sz_local = (size_t)buf;
  buf_local = arg;
  iVar1 = nni_copyin_ms(&local_34,buf,sz,t);
  if (iVar1 == 0) {
    nni_atomic_set((nni_atomic_int *)((long)_rv + 0x74),local_34);
  }
  return iVar1;
}

Assistant:

static int
surv0_ctx_set_survey_time(
    void *arg, const void *buf, size_t sz, nni_opt_type t)
{
	surv0_ctx   *ctx = arg;
	nng_duration expire;
	int          rv;
	if ((rv = nni_copyin_ms(&expire, buf, sz, t)) == 0) {
		nni_atomic_set(&ctx->survey_time, expire);
	}
	return (rv);
}